

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::(anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  long *plVar1;
  long lVar2;
  Type TVar3;
  string *extraout_RAX;
  
  TVar3 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar3 == TYPE_GROUP) {
    this = (_anonymous_namespace_ *)FieldDescriptor::message_type((FieldDescriptor *)this);
  }
  plVar1 = *(long **)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *plVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,plVar1[1] + lVar2);
  return extraout_RAX;
}

Assistant:

string NameFromFieldDescriptor(const FieldDescriptor* field) {
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    return field->message_type()->name();
  } else {
    return field->name();
  }
}